

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxemu.cpp
# Opt level: O3

bool keys(void)

{
  int iVar1;
  int iVar2;
  char m;
  string local_30;
  
  iVar1 = wgetch(_stdscr);
  if (iVar1 < 0x72) {
    if (iVar1 < 0x20) {
      if (iVar1 == 0) {
        return false;
      }
      if (iVar1 == 9) {
        if (awin == '\0') {
          awin = '\x01';
        }
        else {
          awin = '\0';
        }
      }
      else if (iVar1 == 10) {
        return false;
      }
    }
    else if (iVar1 == 0x20) {
      if (running == false) {
        Cpu::lookup_abi_cxx11_(&local_30,&cpu);
        iVar1 = std::__cxx11::string::compare((char *)&local_30);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_30._M_dataplus._M_p._1_7_,local_30._M_dataplus._M_p._0_1_) !=
            &local_30.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_30._M_dataplus._M_p._1_7_,local_30._M_dataplus._M_p._0_1_))
          ;
        }
        if (iVar1 == 0) {
          Cpu::reset(&cpu);
        }
        Cpu::execute(&cpu);
        cursorrow = (int)*pc;
        romr = (uint)*pc * 0x23;
        goto LAB_00108501;
      }
    }
    else if (iVar1 == 0x52) {
      running = false;
      Cpu::reset(&cpu);
    }
    else if (iVar1 == 0x62) {
      breakpoint[cursorrow] = (bool)(breakpoint[cursorrow] ^ 1);
    }
  }
  else if (iVar1 < 0x103) {
    if (iVar1 == 0x72) {
      Cpu::lookup_abi_cxx11_(&local_30,&cpu);
      iVar1 = std::__cxx11::string::compare((char *)&local_30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_30._M_dataplus._M_p._1_7_,local_30._M_dataplus._M_p._0_1_) !=
          &local_30.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_30._M_dataplus._M_p._1_7_,local_30._M_dataplus._M_p._0_1_));
      }
      if (iVar1 == 0) {
        Cpu::reset(&cpu);
      }
      if (running != false) goto LAB_001083ce;
      local_30._M_dataplus._M_p._0_1_ = 0x72;
LAB_00108436:
      running = true;
      pthread_create(&walkthread,(pthread_attr_t *)0x0,run,&local_30);
    }
    else if (iVar1 == 0x77) {
      Cpu::lookup_abi_cxx11_(&local_30,&cpu);
      iVar1 = std::__cxx11::string::compare((char *)&local_30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_30._M_dataplus._M_p._1_7_,local_30._M_dataplus._M_p._0_1_) !=
          &local_30.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_30._M_dataplus._M_p._1_7_,local_30._M_dataplus._M_p._0_1_));
      }
      if (iVar1 == 0) {
        Cpu::reset(&cpu);
      }
      if (running == false) {
        local_30._M_dataplus._M_p._0_1_ = 0x77;
        goto LAB_00108436;
      }
LAB_001083ce:
      running = false;
    }
    else if (iVar1 == 0x102) {
      if (awin == '\0') {
        if ((cursorrow < 0xfff) &&
           (cursorrow = cursorrow + 1, row * 0x23 + romr + -0x46 <= cursorrow * 0x23)) {
          romr = romr + 0x23;
        }
      }
      else {
        ramr = ramr + 0x35;
      }
    }
  }
  else if (iVar1 == 0x153) {
    if (awin == '\0') {
      iVar1 = romr + row * -0x23 + 0x46;
      iVar2 = romr + row * -0x23 + (int)((ulong)((long)iVar1 * -0x15f15f15) >> 0x20) + 0x46;
LAB_001085ba:
      cursorrow = (iVar2 >> 5) - (iVar2 >> 0x1f);
      romr = iVar1;
    }
    else {
      ramr = (row / 2) * -0x35 + ramr + 0x6a;
    }
  }
  else if (iVar1 == 0x152) {
    if (awin == '\0') {
      iVar1 = romr + row * 0x23 + -0x46;
      iVar2 = romr + row * 0x23 + (int)((ulong)((long)iVar1 * -0x15f15f15) >> 0x20) + -0x46;
      goto LAB_001085ba;
    }
    ramr = (row / 2) * 0x35 + ramr + -0x6a;
  }
  else if (iVar1 == 0x103) {
    if (awin == '\0') {
      if ((0 < cursorrow) && (cursorrow = cursorrow + -1, cursorrow * 0x23 < romr)) {
        romr = romr + -0x23;
      }
    }
    else {
      ramr = ramr + -0x35;
    }
  }
  if (romr < 0) {
    romr = 0;
    cursorrow = 0;
  }
LAB_00108501:
  if (ramr < 0) {
    ramr = 0;
  }
  if (0x1002 < (int)((uint)romr / 0x23 + row)) {
    romr = (0x1002 - row) * 0x23;
  }
  if (0x22 < (int)((uint)ramr / 0x35 + row / 2)) {
    ramr = (0x22 - row / 2) * 0x35;
  }
  return true;
}

Assistant:

bool keys()
{
	int ch = getch();
	switch (ch)
	{
			case KEY_UP:
			if (awin == 0)
			{
				if (cursorrow > 0)
				{
					cursorrow--;
					if (cursorrow*35 < romr)romr -= 35;
				}
			}
			else ramr = ramr - 53;
			break;
			case KEY_PPAGE:
			if (awin == 0)
			{
				romr = romr - (row - 2) * 35;
				cursorrow = romr / 35;
			}
			else
				ramr = ramr - (row / 2 - 2) * 53;

			break;
			case KEY_DOWN:
			if (awin == 0)
			{
				if (cursorrow < 4095)
				{
					cursorrow++;
					if (cursorrow*35 >= romr + (row - 2) * 35)romr += 35;
				}
			}
			else
				ramr = ramr + 53;
			break;
			case KEY_NPAGE:
			if (awin == 0)
			{
				romr = romr + (row - 2) * 35;
				cursorrow = romr / 35;
			}
			else ramr = ramr + (row / 2 - 2) * 53;
			break;
			case 10:      // enter
			ch = 0;
			break;
			case 32:      // space
			if (!running)
			{
				if (cpu.lookup() == "END")
				{
					cpu.reset();
				}
				cpu.execute();
				romr = 35 * (*pc);
				cursorrow = romr / 35;
			}
			break;
			case 9:      //tab
			if (awin == 0)awin = 1;
			else awin = 0;
			break;
			case 'r':
			if (cpu.lookup() == "END")
			{
				cpu.reset();
			}
			if (!running)
			{
				running = true;
				char m = 'r';
				pthread_create( &walkthread, NULL, &run, &m);
			}
			else running = false;
			break;
			case 'R':
			running = false;
			cpu.reset();
			break;
			case 'w':
			if (cpu.lookup() == "END")
			{
				cpu.reset();
			}
			if (!running)
			{
				running = true;
				char m = 'w';
				pthread_create( &walkthread, NULL, &run, &m);
			}
			else running = false;
			break;
			case 'b':
				breakpoint[cursorrow] = !breakpoint[cursorrow];
			break;
	}
	if (ch == 0) return false;
	if (romr < 0)
	{
		romr = 0;
		cursorrow = 0;
	}
	if (ramr < 0)ramr = 0;
	if ((romr / 35 + row - 2) > 4096)romr = (4096 - row + 2) * 35;
	if ((ramr / 53 + row / 2 - 2) > 32)ramr = (32 - row / 2 + 2) * 53;
	return true;
}